

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cpp
# Opt level: O3

void __thiscall Gluco::SimpSolver::gatherTouchedClauses(SimpSolver *this)

{
  Queue<unsigned_int> *this_00;
  ulong *puVar1;
  uint uVar2;
  int iVar3;
  ulong in_RAX;
  uint *puVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  vec<unsigned_int> *pvVar11;
  undefined8 uStack_38;
  
  if (this->n_touched != 0) {
    this_00 = &this->subsumption_queue;
    iVar3 = (this->subsumption_queue).end;
    iVar5 = (this->subsumption_queue).buf.sz;
    iVar6 = (this->subsumption_queue).first;
    iVar8 = 0;
    iVar9 = 0;
    if (iVar3 < iVar6) {
      iVar9 = iVar5;
    }
    iVar10 = iVar9 + (iVar3 - iVar6);
    uStack_38 = in_RAX;
    if (iVar10 != 0 && SCARRY4(iVar9,iVar3 - iVar6) == iVar10 < 0) {
      do {
        puVar4 = Queue<unsigned_int>::operator[](this_00,iVar8);
        if ((this->super_Solver).ca.super_RegionAllocator<unsigned_int>.sz <= *puVar4)
        goto LAB_005c7e9e;
        if (((this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory[*puVar4] & 3) == 0)
        {
          puVar4 = Queue<unsigned_int>::operator[](this_00,iVar8);
          uVar2 = *puVar4;
          if ((this->super_Solver).ca.super_RegionAllocator<unsigned_int>.sz <= uVar2)
          goto LAB_005c7e9e;
          puVar4 = (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory;
          *(ulong *)(puVar4 + uVar2) = *(ulong *)(puVar4 + uVar2) & 0xfffffffffffffffc | 2;
        }
        iVar8 = iVar8 + 1;
        iVar3 = (this->subsumption_queue).end;
        iVar5 = (this->subsumption_queue).buf.sz;
        iVar6 = (this->subsumption_queue).first;
        iVar9 = 0;
        if (iVar3 < iVar6) {
          iVar9 = iVar5;
        }
      } while (iVar8 < (iVar3 - iVar6) + iVar9);
    }
    uStack_38 = uStack_38 & 0xffffffff;
    iVar9 = (this->touched).sz;
    if (0 < iVar9) {
      iVar3 = 0;
      do {
        lVar7 = (long)iVar3;
        if ((this->touched).data[lVar7] != '\0') {
          if ((this->occurs).dirty.data[lVar7] != '\0') {
            OccLists<int,_Gluco::vec<unsigned_int>,_Gluco::SimpSolver::ClauseDeleted>::clean
                      (&this->occurs,(int *)((long)&uStack_38 + 4));
            lVar7 = (long)uStack_38._4_4_;
            iVar3 = uStack_38._4_4_;
          }
          pvVar11 = (this->occurs).occs.data;
          iVar5 = pvVar11[lVar7].sz;
          if (0 < iVar5) {
            pvVar11 = pvVar11 + lVar7;
            lVar7 = 0;
            do {
              uVar2 = pvVar11->data[lVar7];
              if ((this->super_Solver).ca.super_RegionAllocator<unsigned_int>.sz <= uVar2)
              goto LAB_005c7e9e;
              if (((this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory[uVar2] & 3) ==
                  0) {
                Queue<unsigned_int>::insert(this_00,uVar2);
                uVar2 = pvVar11->data[lVar7];
                if ((this->super_Solver).ca.super_RegionAllocator<unsigned_int>.sz <= uVar2)
                goto LAB_005c7e9e;
                puVar4 = (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory;
                *(ulong *)(puVar4 + uVar2) = *(ulong *)(puVar4 + uVar2) & 0xfffffffffffffffc | 2;
                iVar5 = pvVar11->sz;
              }
              lVar7 = lVar7 + 1;
            } while (lVar7 < iVar5);
            iVar3 = uStack_38._4_4_;
          }
          (this->touched).data[iVar3] = '\0';
          iVar9 = (this->touched).sz;
          iVar3 = uStack_38._4_4_;
        }
        iVar3 = iVar3 + 1;
        uStack_38 = CONCAT44(iVar3,(undefined4)uStack_38);
      } while (iVar3 < iVar9);
      iVar3 = (this->subsumption_queue).end;
      iVar5 = (this->subsumption_queue).buf.sz;
      iVar6 = (this->subsumption_queue).first;
    }
    iVar9 = 0;
    uStack_38 = uStack_38 & 0xffffffff;
    if (iVar6 <= iVar3) {
      iVar5 = 0;
    }
    iVar8 = iVar5 + (iVar3 - iVar6);
    if (iVar8 != 0 && SCARRY4(iVar5,iVar3 - iVar6) == iVar8 < 0) {
      do {
        puVar4 = Queue<unsigned_int>::operator[](this_00,iVar9);
        if ((this->super_Solver).ca.super_RegionAllocator<unsigned_int>.sz <= *puVar4) {
LAB_005c7e9e:
          __assert_fail("r >= 0 && r < sz",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/Alloc.h"
                        ,0x42,
                        "T &Gluco::RegionAllocator<unsigned int>::operator[](Ref) [T = unsigned int]"
                       );
        }
        if (((this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory[*puVar4] & 3) == 2)
        {
          puVar4 = Queue<unsigned_int>::operator[](this_00,uStack_38._4_4_);
          if ((this->super_Solver).ca.super_RegionAllocator<unsigned_int>.sz <= *puVar4)
          goto LAB_005c7e9e;
          puVar1 = (ulong *)((this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory +
                            *puVar4);
          *puVar1 = *puVar1 & 0xfffffffffffffffc;
        }
        iVar9 = uStack_38._4_4_ + 1;
        uStack_38 = CONCAT44(iVar9,(undefined4)uStack_38);
        iVar3 = (this->subsumption_queue).end;
        iVar6 = 0;
        iVar5 = (this->subsumption_queue).first;
        if (iVar3 < iVar5) {
          iVar6 = (this->subsumption_queue).buf.sz;
        }
      } while (iVar9 < (iVar3 - iVar5) + iVar6);
    }
    this->n_touched = 0;
  }
  return;
}

Assistant:

void SimpSolver::gatherTouchedClauses()
{
    if (n_touched == 0) return;

    int i,j;
    for (i = j = 0; i < subsumption_queue.size(); i++)
        if (ca[subsumption_queue[i]].mark() == 0)
            ca[subsumption_queue[i]].mark(2);

    for (i = 0; i < touched.size(); i++)
        if (touched[i]){
            const vec<CRef>& cs = occurs.lookup(i);
            for (j = 0; j < cs.size(); j++)
                if (ca[cs[j]].mark() == 0){
                    subsumption_queue.insert(cs[j]);
                    ca[cs[j]].mark(2);
                }
            touched[i] = 0;
        }

    for (i = 0; i < subsumption_queue.size(); i++)
        if (ca[subsumption_queue[i]].mark() == 2)
            ca[subsumption_queue[i]].mark(0);

    n_touched = 0;
}